

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void add_new_tile(vector<Tile_*,_std::allocator<Tile_*>_> *tiles,Tile *tile)

{
  size_type sVar1;
  Tile *local_18;
  Tile *tile_local;
  vector<Tile_*,_std::allocator<Tile_*>_> *tiles_local;
  
  local_18 = tile;
  tile_local = (Tile *)tiles;
  sVar1 = std::vector<Tile_*,_std::allocator<Tile_*>_>::size(tiles);
  local_18->id = (uint16_t)sVar1;
  std::vector<Tile_*,_std::allocator<Tile_*>_>::push_back
            ((vector<Tile_*,_std::allocator<Tile_*>_> *)tile_local,&local_18);
  return;
}

Assistant:

void add_new_tile(std::vector<Tile *> *tiles, Tile *tile) {
    tile->id = tiles->size();
    tiles->push_back(tile);
}